

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O1

int fits_make_longstr_key_util
              (fitsfile *fptr,char *keyname,char *value,char *comm,int position,int *status)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  char *pcVar13;
  int iVar14;
  int tstatus;
  char valstring [81];
  char tmpkeyname [75];
  char tstring [81];
  char comstring [81];
  char card [81];
  size_t local_258;
  int local_250;
  int local_24c;
  size_t local_248;
  int local_22c;
  int local_204;
  undefined1 local_200 [8];
  char local_1f8 [95];
  char acStack_199 [2];
  undefined7 uStack_197;
  char local_190;
  undefined1 local_14e;
  char local_148 [96];
  char local_e8 [96];
  char local_88 [8];
  undefined2 local_80;
  
  local_204 = -1;
  if (0 < *status) {
    return *status;
  }
  local_248 = strlen(value);
  local_200 = (undefined1  [8])value;
  if (comm == (char *)0x0) {
    local_258 = 0;
  }
  else {
    local_258 = strlen(comm);
  }
  acStack_199[1] = '\0';
  pcVar13 = keyname + -1;
  do {
    pcVar1 = pcVar13 + 1;
    pcVar13 = pcVar13 + 1;
  } while (*pcVar1 == ' ');
  strncpy(acStack_199 + 1,pcVar13,0x4a);
  local_14e = 0;
  sVar8 = strlen(acStack_199 + 1);
  if ((int)sVar8 == 0) {
    iVar12 = 0;
  }
  else {
    cVar2 = acStack_199[(int)sVar8];
    pcVar13 = acStack_199 + (int)sVar8;
    while (cVar2 == ' ') {
      *pcVar13 = '\0';
      cVar2 = pcVar13[-1];
      pcVar13 = pcVar13 + -1;
    }
    sVar8 = strlen(acStack_199 + 1);
    iVar12 = (int)sVar8;
  }
  if ((iVar12 < 9) && (iVar7 = fftkey(pcVar13,&local_204), iVar7 < 1)) {
    local_22c = 0x44;
    iVar12 = 10;
    goto LAB_001af0cd;
  }
  if (iVar12 == 0) {
LAB_001af065:
    if (0x45 < iVar12) {
      ffpmsg("The following keyword is too long to fit on a card in ffpkls:");
      ffpmsg(keyname);
      *status = 0xcf;
      return 0xcf;
    }
    iVar12 = iVar12 + 0xb;
  }
  else {
    if (acStack_199[1] == 'h') {
      if (local_190 != ' ' || CONCAT71(uStack_197,0x68) != 0x6863726172656968) goto LAB_001af065;
    }
    else if ((acStack_199[1] != 'H') ||
            (local_190 != ' ' || CONCAT71(uStack_197,0x48) != 0x4843524152454948))
    goto LAB_001af065;
    iVar12 = iVar12 + 2;
  }
  local_22c = 0x4e - iVar12;
LAB_001af0cd:
  bVar5 = true;
  bVar6 = false;
  bVar3 = false;
  local_250 = 0;
  local_24c = position;
  do {
    if (bVar3) {
      if ((int)local_258 < 0x30) {
        local_1f8[0] = '\'';
        local_1f8[1] = '\'';
        local_1f8[2] = 0x20;
      }
      else {
        local_1f8[0] = '\'';
        local_1f8[1] = '&';
        local_1f8[2] = 0x27;
      }
      builtin_strncpy(local_1f8 + 3,"                 ",0x12);
      iVar7 = 0x2f;
      if ((int)local_258 < 0x2f) {
        iVar7 = (int)local_258;
      }
      strncpy(local_e8,comm + local_250,(long)iVar7);
      local_e8[iVar7] = '\0';
      local_250 = local_250 + iVar7;
      local_258 = (size_t)(uint)((int)local_258 - iVar7);
      bVar3 = true;
      bVar4 = true;
    }
    else {
      pcVar13 = (char *)((long)local_200 + (long)local_250);
      sVar8 = strlen(pcVar13);
      iVar7 = 0;
      if ((int)(uint)sVar8 < 1) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        if (0 < local_22c) {
          iVar7 = 0;
          uVar11 = 0;
          do {
            iVar7 = (uint)(pcVar13[uVar11] == '\'') + iVar7;
            uVar10 = uVar11 + 1;
            if (((uint)sVar8 & 0x7fffffff) <= uVar10) break;
            iVar14 = (int)uVar11;
            uVar11 = uVar10;
          } while (iVar14 + iVar7 + 1 < local_22c);
        }
      }
      iVar14 = local_22c - iVar7;
      if ((int)uVar10 < local_22c - iVar7) {
        iVar14 = (int)uVar10;
      }
      local_148[0] = '\0';
      strncat(local_148,pcVar13,(long)iVar14);
      if (bVar5) {
        ffs2c(local_148,local_1f8,status);
        sVar8 = strlen(local_1f8);
        iVar7 = (int)sVar8;
        iVar9 = 0x50 - (iVar12 + iVar7);
      }
      else {
        ffs2c_nopad(local_148,local_1f8,status);
        sVar8 = strlen(local_1f8);
        iVar7 = (int)sVar8;
        iVar9 = 0x46 - iVar7;
      }
      if ((bool)((int)local_248 == iVar14 & bVar5)) {
        bVar3 = bVar6;
        if (iVar12 + (int)local_258 + iVar7 < 0x4e) {
          bVar3 = true;
        }
        if ((int)local_258 < 0x2f) {
          bVar6 = bVar3;
        }
      }
      if (!bVar6) {
        if (iVar9 == 0) {
          if (((int)local_258 == 0) && ((int)local_248 <= iVar14)) goto LAB_001af307;
          iVar14 = iVar14 + -1;
          if (local_200[(long)iVar7 + 6] == '\'') {
            local_200[(long)iVar7 + 5] = 0x26;
            local_200[(long)iVar7 + 7] = 0;
          }
          else {
            local_200[(long)iVar7 + 6] = 0x26;
          }
        }
        else {
          if ((int)local_248 <= iVar14) {
LAB_001af307:
            if (((int)local_258 == 0) ||
               (((0x31 < iVar9 && ((int)local_258 < 0x30)) && ((int)local_258 <= iVar9 + -3))))
            goto LAB_001af342;
          }
          *(undefined2 *)(local_200 + (long)iVar7 + 7) = 0x2726;
          local_1f8[(long)iVar7 + 1] = '\0';
        }
      }
LAB_001af342:
      if (bVar6) {
        if (comm == (char *)0x0) {
          local_e8[0] = '\0';
        }
        else {
          strcpy(local_e8,comm);
        }
        bVar6 = true;
        bVar4 = true;
        local_248 = 0;
        local_258 = 0;
        bVar3 = false;
      }
      else {
        if ((int)local_248 - iVar14 == 0 || (int)local_248 < iVar14) {
          bVar3 = true;
          if ((int)local_258 == 0) {
            local_258 = 0;
          }
          else {
            local_248 = 0;
            if (0x31 < iVar9) {
              local_250 = 0x2f;
              if ((int)local_258 < 0x2f) {
                local_250 = (int)local_258;
              }
              strncpy(local_e8,comm,(long)local_250);
              local_e8[local_250] = '\0';
              local_258 = (size_t)(uint)((int)local_258 - local_250);
              bVar4 = true;
              goto LAB_001af437;
            }
          }
          local_248 = 0;
          local_250 = 0;
          bVar4 = false;
        }
        else {
          local_250 = local_250 + iVar14;
          bVar4 = false;
          local_22c = 0x44;
          bVar3 = false;
          local_248 = (ulong)(uint)((int)local_248 - iVar14);
        }
LAB_001af437:
        bVar6 = false;
      }
    }
    if (bVar5) {
      if (bVar4) {
        pcVar13 = local_e8;
      }
      else {
        pcVar13 = (char *)0x0;
      }
      ffmkky(keyname,local_1f8,pcVar13,local_88,status);
    }
    else {
      if (bVar4) {
        pcVar13 = local_e8;
      }
      else {
        pcVar13 = (char *)0x0;
      }
      ffmkky("CONTINUE",local_1f8,pcVar13,local_88,status);
      local_80 = 0x2020;
    }
    if (local_24c < 0) {
      ffprec(fptr,local_88,status);
    }
    else {
      ffirec(fptr,local_24c,local_88,status);
      local_24c = local_24c + 1;
    }
    bVar5 = false;
    if (((int)local_248 < 1) && ((int)local_258 < 1)) {
      return *status;
    }
  } while( true );
}

Assistant:

int fits_make_longstr_key_util( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *keyname,/* I - name of keyword to write */
            const char *value,  /* I - keyword value            */
            const char *comm,   /* I - keyword comment          */
            int position,       /* I - position to insert (-1 for end) */
            int  *status)       /* IO - error status            */
/*
  Write (put) the keyword, value and comment into the FITS header.
  This routine is a modified version of ffpkys which supports the
  HEASARC long string convention and can write arbitrarily long string
  keyword values.  The value is continued over multiple keywords that
  have the name CONTINUE without an equal sign in column 9 of the card.
  This routine also supports simple string keywords which are less than
  75 characters in length.
*/
{
    char valstring[FLEN_CARD], comstring[FLEN_CARD];
    /* give tmpkeyname same size restriction as in ffmkky */
    char card[FLEN_CARD], tmpkeyname[FLEN_KEYWORD];
    char tstring[FLEN_CARD], *cptr;
    int next, remainval, remaincom, vlen, nquote, nchar; 
    int namelen, finalnamelen, maxvalchars;
    int contin, tstatus=-1, nocomment=0, ichar, addline=1;
    int spaceForComments=0, processingComment=0, nblanks=0, allInOne=0;
    /* This setting is arbitrary */
    int fixedSpaceForComments = 50;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    remainval = strlen(value);   
    if (comm)
       remaincom = strlen(comm);
    else
       remaincom = 0;

    tmpkeyname[0] = '\0';    
    cptr = keyname;
    while(*cptr == ' ')   /* skip over leading spaces in name */
        cptr++;
        
    strncpy(tmpkeyname, cptr, FLEN_KEYWORD-1);
    tmpkeyname[FLEN_KEYWORD-1] = '\0';
    
    namelen = strlen(tmpkeyname);
    if (namelen)         /* skip trailing spaces in name */
    {
       cptr = tmpkeyname + namelen - 1;
       while (*cptr == ' ')
       {
          *cptr = '\0';
          cptr--;
       }
       namelen = strlen(tmpkeyname);
    }
    
    /* First determine final length of keyword.  ffmkky may prepend 
       "HIERARCH " to it, and we need to determine that now using the
       same criteria as ffmkky. */
    
    if (namelen <= 8 && (fftkey(cptr, &tstatus) <= 0) )
    {
       /* This a normal 8-character FITS keyword. ffmkky
          will pad it to 8 if necessary, and add "= ". */
       finalnamelen = 10;
       /* 2 additional chars are needed for opening/closing quotes. */
       maxvalchars = (FLEN_CARD-1) - finalnamelen  - 2;
    }
    else
    { 
       if (namelen && ((FSTRNCMP(tmpkeyname, "HIERARCH ", 9) == 0) ||
                   (FSTRNCMP(tmpkeyname, "hierarch ", 9) == 0)) )
       {
          /* We have an explicitly marked long keyword, so HIERARCH
             will not be prepended.  However it can then have
             " = " or "= ", depending on size of value string. 
             For now, assume "= ". 
             
             If we're here, must have 75 > namelen > 9. */
          finalnamelen = namelen + 2;
       }
       else
       {
          /* ffmkky is going to prepend "HIERARCH " to the keyword,
             and " = " or "= ". */
          finalnamelen = namelen + 11;
          if (finalnamelen > FLEN_CARD-1)
          {
             ffpmsg("The following keyword is too long to fit on a card in ffpkls:");
             ffpmsg(keyname);
             return(*status = BAD_KEYCHAR);
          }
       }
       maxvalchars = (FLEN_CARD-1) - finalnamelen - 2;       
    }
    
    contin = 0;
    next = 0;                  /* pointer to next character to write */

    while (addline)
    {
        if (processingComment)
        {
           if (remaincom > (fixedSpaceForComments-3))
           {
              strcpy(valstring,"'&'");
              nblanks = (FLEN_CARD-1) - fixedSpaceForComments - 13;
              memset(&valstring[3], 32, nblanks);
              valstring[nblanks+3] = '\0';
           }
           else
           {
              strcpy(valstring,"''");
              nblanks = (FLEN_CARD-1) - fixedSpaceForComments - 12;
              memset(&valstring[2], 32, nblanks);
              valstring[nblanks+2] = '\0';
           }
           nchar = minvalue(remaincom, fixedSpaceForComments-3);
           strncpy(comstring, &comm[next], nchar);
           comstring[nchar] = '\0';
           next += nchar;
           remaincom -= nchar;
        }
        else
        {
           vlen = strlen(&value[next]);
           nquote = 0;
           for (ichar=0; ichar<vlen && (ichar+nquote)<maxvalchars; ++ichar)
           {
              if (value[next+ichar] == '\'')
                 ++nquote;
           }
           /* Note that (ichar+nquote) can be 1 greater than maxvalchars
              if last processed char is a quote.  Therefore do this check: */
           nchar = minvalue(ichar,(maxvalchars-nquote));
    
           tstring[0] = '\0';
           strncat(tstring, &value[next], nchar); /* copy string to temp buff */
           /* expand quotes, and put quotes around the string */
           if (contin)
           {
              ffs2c_nopad(tstring,valstring,status);
              vlen = strlen(valstring);
              spaceForComments = (FLEN_CARD-1) - (10 + vlen);
           }
           else
           {
              ffs2c(tstring, valstring, status);
              vlen = strlen(valstring);
              spaceForComments = (FLEN_CARD-1) - (finalnamelen + vlen);
           }
           
           /* Check for simplest case where everything fits on first line.*/
           if (!contin && (remainval==nchar) && 
                      (finalnamelen+vlen+remaincom+3 < FLEN_CARD) &&
                      remaincom < fixedSpaceForComments-3)
              allInOne=1;
           
           if (!allInOne)
           {   
              /* There are 2 situations which require overwriting the last char of
                 valstring with a continue symbol '&' */
              if (!spaceForComments && (remaincom || (remainval > nchar)))

              {
                  nchar -= 1;        /* outputting one less character now */

                  if (valstring[vlen-2] != '\'')
                      valstring[vlen-2] = '&';  /*  overwrite last char with &  */
                  else
                  { /* last char was a pair of single quotes, so over write both */
                      valstring[vlen-3] = '&';
                      valstring[vlen-1] = '\0';
                  }
              }
              else if ( 
               /* Cases where '&' should be appended to valstring rather than
                   overwritten.  This would mostly be due to the inclusion
                   of a comment string requiring additional lines.  But there's
                   also the obscure case where the last character that can
                   fit happened to be a single quote.  Since this was removed
                   with the earlier 'nchar = minvlaue()' test, the valstring
                   must be continued even though it's one space short of filling
                   this line.  We then append it with a '&'. */


              (spaceForComments && nchar < remainval) || 
              (remaincom && (spaceForComments < fixedSpaceForComments ||
                        spaceForComments-3 < remaincom ||
                        remaincom > fixedSpaceForComments-3))) 
              {
                valstring[vlen-1] = '&';
                 valstring[vlen] = '\'';
                 valstring[vlen+1] = '\0';
                 vlen+=1;
              }
           }
           
           if (allInOne)
           {
              nocomment=0;
              /* The allInOne test ensures that comm length will
                 fit within FLEN_CARD buffer size */
              if (comm)
                 strcpy(comstring, comm);
              else
                 comstring[0]='\0';
              /* Ensure that loop exits after this iteration */
              remainval=0;
              remaincom=0;
           }
           else if (remainval > nchar)
           {
              nocomment = 1;
              remainval -= nchar;
              next  += nchar;
              maxvalchars = (FLEN_CARD-1) - 12;
           }
           else
           {
              /* We've reached the end of val input.  Now switch to writing
                 comment (if any).  This block can only be reached once. */
              /* Do not write comments on this line if fewer than
                 fixedSpaceForComments are available for the comment string 
                 and " / ". */
              nocomment = 1;
              remainval = 0;
              next = 0;
              processingComment = 1;
              if (remaincom && spaceForComments >= fixedSpaceForComments)
              {
                 nocomment = 0;
                 nchar = minvalue(remaincom, fixedSpaceForComments-3);
                 strncpy(comstring, comm, nchar);
                 comstring[nchar] = '\0';
                 next = nchar;
                 remaincom -= nchar;
              }
           }

        } /* end if processing valstring and not comment */

        if (contin)           /* This is a CONTINUEd keyword */
        {
           if (nocomment) {
               ffmkky("CONTINUE", valstring, NULL, card, status); /* make keyword w/o comment */
           } else {
               ffmkky("CONTINUE", valstring, comstring, card, status); /* make keyword */
	   }
           strncpy(&card[8], "   ",  2);  /* overwrite the '=' */
        }
        else
        {
           if (nocomment)
              ffmkky(keyname, valstring, NULL, card, status);  /* make keyword */
           else
              ffmkky(keyname, valstring, comstring, card, status);  /* make keyword */
        }

        if (position < 0)
           ffprec(fptr, card, status);  /* write the keyword */
        else
        {
           ffirec(fptr, position, card, status);  /* insert the keyword */
           ++position;
        }
           
        contin = 1;
        nocomment = 0;
        addline = (int)(remainval > 0 || remaincom > 0);
    }
    return(*status);
}